

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O2

void * chck_pool_iter(chck_pool *pool,size_t *iter,_Bool reverse)

{
  _Bool _Var1;
  void *pvVar2;
  size_t index;
  
  if ((pool != (chck_pool *)0x0) && (iter != (size_t *)0x0)) {
    if ((pool->items).member != 0) {
      index = *iter;
      do {
        _Var1 = pool_is_mapped(pool,index);
        pvVar2 = pool_buffer_iter(&pool->items,iter,reverse);
        if (_Var1 && pvVar2 != (void *)0x0) {
          return pvVar2;
        }
        index = *iter;
      } while (index < (pool->map).used / (pool->map).member);
    }
    return (void *)0x0;
  }
  __assert_fail("pool && iter",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0x19c,"void *chck_pool_iter(const struct chck_pool *, size_t *, _Bool)");
}

Assistant:

void*
chck_pool_iter(const struct chck_pool *pool, size_t *iter, bool reverse)
{
   assert(pool && iter);

   if (!pool->items.member)
      return NULL;

   void *current = NULL;
   do {
      const bool mapped = pool_is_mapped(pool, *iter);
      current = pool_buffer_iter(&pool->items, iter, reverse);
      current = (mapped ? current : NULL);
   } while (!current && *iter < pool->map.used / pool->map.member);

   return current;
}